

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  ushort uVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  MemPage *pPage_00;
  bool bVar3;
  char cVar4;
  u16 uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  u8 *puVar9;
  char cVar10;
  u8 *puVar11;
  CellInfo info;
  int local_64;
  Pgno local_60;
  uint local_5c;
  ulong local_58;
  long local_50;
  CellInfo local_48;
  
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  local_50 = (long)pCur->iPage;
  uVar1 = pCur->ix;
  pPage = pCur->apPage[local_50];
  puVar11 = pPage->aData +
            (CONCAT11(pPage->aCellIdx[(ulong)uVar1 * 2],pPage->aCellIdx[(ulong)uVar1 * 2 + 1]) &
            pPage->maskPage);
  bVar3 = true;
  uVar8 = (uint)CONCAT71(in_register_00000031,flags);
  local_5c = uVar8;
  if ((flags & 2) != 0) {
    if (pPage->leaf != '\0') {
      uVar2 = pPage->nFree;
      puVar9 = puVar11;
      uVar5 = cellSizePtr(pPage,puVar11);
      uVar8 = (uint)puVar9;
      if ((uint)uVar5 + (uint)uVar2 + 2 <= (pBt->usableSize * 2) / 3) {
        bVar3 = false;
        goto LAB_0013e3a3;
      }
    }
    iVar6 = saveCursorKey(pCur);
    if (iVar6 != 0) {
      return iVar6;
    }
  }
LAB_0013e3a3:
  if (((pPage->leaf != '\0') || (iVar6 = sqlite3BtreePrevious(pCur,uVar8), iVar6 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 || (iVar6 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar6 == 0)
      ))) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
    }
    iVar6 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar6 == 0) {
      local_64 = clearCell(pPage,puVar11,&local_48);
      dropCell(pPage,(uint)uVar1,(uint)local_48.nSize,&local_64);
      iVar6 = local_64;
      if (local_64 == 0) {
        if (pPage->leaf == '\0') {
          pPage_00 = pCur->apPage[pCur->iPage];
          uVar8 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                  pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                        pPage_00->maskPage);
          if (uVar8 < 4) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10971,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            return 0xb;
          }
          local_60 = pCur->apPage[local_50 + 1]->pgno;
          puVar11 = pPage_00->aData;
          uVar5 = (*pPage_00->xCellSize)(pPage_00,puVar11 + uVar8);
          local_58 = (ulong)uVar5;
          puVar9 = pBt->pTmpSpace;
          local_64 = sqlite3PagerWrite(pPage_00->pDbPage);
          if (local_64 == 0) {
            insertCell(pPage,(uint)uVar1,puVar11 + uVar8 + -4,(int)local_58 + 4,puVar9,local_60,
                       &local_64);
          }
          dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_64);
          if (local_64 != 0) {
            return local_64;
          }
        }
        iVar6 = balance(pCur);
        if (iVar6 == 0) {
          cVar4 = pCur->iPage;
          cVar10 = (char)local_50;
          if (cVar10 < cVar4) {
            do {
              pCur->iPage = cVar4 + -1;
              lVar7 = (long)cVar4;
              cVar4 = cVar4 + -1;
              if (pCur->apPage[lVar7] != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pCur->apPage[lVar7]->pDbPage);
                cVar4 = pCur->iPage;
              }
            } while (cVar10 < cVar4);
            iVar6 = balance(pCur);
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          if (bVar3) {
            iVar6 = moveToRoot(pCur);
            if ((local_5c & 2) != 0) {
              pCur->eState = '\x03';
            }
          }
          else {
            pCur->eState = '\x02';
            uVar2 = pPage->nCell;
            if (uVar1 < uVar2) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->ix = uVar2 - 1;
            }
            iVar6 = 0;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( pCur->ix<pCur->apPage[pCur->iPage]->nCell );
  assert( pCur->eState==CURSOR_VALID );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->apPage[pCur->iPage] || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        pCur->eState = CURSOR_REQUIRESEEK;
      }
    }
  }
  return rc;
}